

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumericTests.cpp
# Opt level: O0

void testDiv(SVInt *a,SVInt *b,SVInt *c)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  bool bVar1;
  ExprLhs<const_slang::SVInt_&> rhs;
  ExprLhs<const_slang::SVInt_&> this;
  AssertionHandler catchAssertionHandler_5;
  AssertionHandler catchAssertionHandler_4;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  SVInt r;
  SVInt q;
  SVInt p;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffaac;
  AssertionHandler *in_stack_fffffffffffffab0;
  SVInt *in_stack_fffffffffffffab8;
  SourceLineInfo *this_00;
  ExprLhs<const_slang::SVInt_&> in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffac8;
  SourceLineInfo *this_01;
  SVInt *in_stack_fffffffffffffad0;
  undefined1 *puVar3;
  undefined6 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffade;
  undefined1 in_stack_fffffffffffffadf;
  Flags resultDisposition;
  SVInt *in_stack_fffffffffffffae0;
  ExprLhs<const_slang::SVInt_&> *in_stack_fffffffffffffae8;
  SourceLineInfo *this_02;
  SourceLineInfo local_488;
  StringRef local_478;
  SVInt *in_stack_fffffffffffffbb0;
  SVInt *in_stack_fffffffffffffbb8;
  SourceLineInfo local_3d0;
  StringRef local_3c0;
  undefined1 local_358 [22];
  uint8_t local_342;
  SVInt *local_340;
  StringRef local_308;
  SourceLineInfo local_2f8;
  StringRef local_2e8;
  SVInt *local_288;
  StringRef local_250;
  SourceLineInfo local_240;
  StringRef local_230;
  SVInt *local_190;
  StringRef local_158;
  SourceLineInfo local_148;
  StringRef local_138;
  SVInt *local_c8;
  StringRef local_90;
  SourceLineInfo local_80;
  StringRef local_70;
  
  local_70 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffab0,
                        CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/NumericTests.cpp"
             ,0x173);
  local_90 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffab0,
                        CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  uVar2 = 1;
  macroName.m_size = (size_type)in_stack_fffffffffffffad0;
  macroName.m_start = in_stack_fffffffffffffac8;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffac0.m_lhs;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffab8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffab0,macroName,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffaac,1),capturedExpression,
             (Flags)in_stack_fffffffffffffae0);
  local_c8 = (SVInt *)Catch::operator<=<const_slang::SVInt_&,_0>
                                ((Decomposer *)CONCAT44(in_stack_fffffffffffffaac,uVar2),
                                 (SVInt *)0x84e82f);
  Catch::operator>=(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffab0,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffaac,uVar2));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffab0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffab0);
  local_138 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffab0,CONCAT44(in_stack_fffffffffffffaac,uVar2)
                        );
  Catch::SourceLineInfo::SourceLineInfo
            (&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/NumericTests.cpp"
             ,0x174);
  local_158 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffab0,CONCAT44(in_stack_fffffffffffffaac,uVar2)
                        );
  uVar2 = 1;
  macroName_00.m_size = (size_type)in_stack_fffffffffffffad0;
  macroName_00.m_start = in_stack_fffffffffffffac8;
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffffac0.m_lhs;
  capturedExpression_00.m_start = (char *)in_stack_fffffffffffffab8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffab0,macroName_00,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffaac,1),capturedExpression_00,
             (Flags)in_stack_fffffffffffffae0);
  local_190 = (SVInt *)Catch::operator<=<const_slang::SVInt_&,_0>
                                 ((Decomposer *)CONCAT44(in_stack_fffffffffffffaac,uVar2),
                                  (SVInt *)0x84e982);
  Catch::operator>(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffab0,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffaac,uVar2));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffab0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffab0);
  slang::SVInt::operator*
            ((SVInt *)CONCAT17(in_stack_fffffffffffffadf,
                               CONCAT16(in_stack_fffffffffffffade,in_stack_fffffffffffffad8)),
             in_stack_fffffffffffffad0);
  slang::SVInt::operator+
            ((SVInt *)CONCAT17(in_stack_fffffffffffffadf,
                               CONCAT16(in_stack_fffffffffffffade,in_stack_fffffffffffffad8)),
             in_stack_fffffffffffffad0);
  slang::SVInt::~SVInt(in_stack_fffffffffffffac0.m_lhs);
  slang::SVInt::operator/(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  slang::SVInt::operator%(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  local_230 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffab0,CONCAT44(in_stack_fffffffffffffaac,uVar2)
                        );
  Catch::SourceLineInfo::SourceLineInfo
            (&local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/NumericTests.cpp"
             ,0x179);
  local_250 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffab0,CONCAT44(in_stack_fffffffffffffaac,uVar2)
                        );
  uVar2 = 2;
  macroName_01.m_size = (size_type)in_stack_fffffffffffffad0;
  macroName_01.m_start = in_stack_fffffffffffffac8;
  capturedExpression_01.m_size = (size_type)in_stack_fffffffffffffac0.m_lhs;
  capturedExpression_01.m_start = (char *)in_stack_fffffffffffffab8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffab0,macroName_01,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffaac,2),capturedExpression_01,
             (Flags)in_stack_fffffffffffffae0);
  local_288 = (SVInt *)Catch::operator<=<const_slang::SVInt_&,_0>
                                 ((Decomposer *)CONCAT44(in_stack_fffffffffffffaac,uVar2),
                                  (SVInt *)0x84eba5);
  Catch::operator==(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  resultDisposition = (Flags)in_stack_fffffffffffffae0;
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffab0,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffaac,uVar2));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffab0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffab0);
  local_2e8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffab0,CONCAT44(in_stack_fffffffffffffaac,uVar2)
                        );
  this_02 = &local_2f8;
  Catch::SourceLineInfo::SourceLineInfo
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/NumericTests.cpp"
             ,0x17a);
  local_308 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffab0,CONCAT44(in_stack_fffffffffffffaac,uVar2)
                        );
  uVar2 = 2;
  macroName_02.m_size = (size_type)in_stack_fffffffffffffad0;
  macroName_02.m_start = in_stack_fffffffffffffac8;
  capturedExpression_02.m_size = (size_type)in_stack_fffffffffffffac0.m_lhs;
  capturedExpression_02.m_start = (char *)in_stack_fffffffffffffab8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffab0,macroName_02,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffaac,2),capturedExpression_02,
             resultDisposition);
  rhs = Catch::operator<=<const_slang::SVInt_&,_0>
                  ((Decomposer *)CONCAT44(in_stack_fffffffffffffaac,uVar2),(SVInt *)0x84edb5);
  local_340 = (SVInt *)rhs;
  Catch::operator==((ExprLhs<const_slang::SVInt_&> *)this_02,rhs.m_lhs);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffab0,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffaac,uVar2));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffab0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffab0);
  local_342 = (uint8_t)slang::SVInt::operator>
                                 (in_stack_fffffffffffffab8,(SVInt *)in_stack_fffffffffffffab0);
  bVar1 = slang::logic_t::operator_cast_to_bool((logic_t *)in_stack_fffffffffffffab0);
  if (bVar1) {
    slang::SVInt::operator/(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    puVar3 = local_358;
    slang::SVInt::operator=(in_stack_fffffffffffffab8,(SVInt *)in_stack_fffffffffffffab0);
    slang::SVInt::~SVInt(in_stack_fffffffffffffac0.m_lhs);
    slang::SVInt::operator%(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    slang::SVInt::operator=(in_stack_fffffffffffffab8,(SVInt *)in_stack_fffffffffffffab0);
    slang::SVInt::~SVInt(in_stack_fffffffffffffac0.m_lhs);
    local_3c0 = operator____catch_sr
                          ((char *)in_stack_fffffffffffffab0,
                           CONCAT44(in_stack_fffffffffffffaac,uVar2));
    this_01 = &local_3d0;
    Catch::SourceLineInfo::SourceLineInfo
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/NumericTests.cpp"
               ,0x17f);
    operator____catch_sr
              ((char *)in_stack_fffffffffffffab0,CONCAT44(in_stack_fffffffffffffaac,uVar2));
    uVar2 = 2;
    macroName_03.m_size = (size_type)puVar3;
    macroName_03.m_start = (char *)this_01;
    capturedExpression_03.m_size = (size_type)in_stack_fffffffffffffac0.m_lhs;
    capturedExpression_03.m_start = (char *)in_stack_fffffffffffffab8;
    Catch::AssertionHandler::AssertionHandler
              (in_stack_fffffffffffffab0,macroName_03,
               (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffaac,2),capturedExpression_03,
               (Flags)rhs.m_lhs);
    in_stack_fffffffffffffac0 =
         Catch::operator<=<const_slang::SVInt_&,_0>
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffaac,uVar2),(SVInt *)0x84f019);
    Catch::operator==((ExprLhs<const_slang::SVInt_&> *)this_02,rhs.m_lhs);
    Catch::AssertionHandler::handleExpr
              (in_stack_fffffffffffffab0,
               (ITransientExpression *)CONCAT44(in_stack_fffffffffffffaac,uVar2));
    Catch::AssertionHandler::complete(in_stack_fffffffffffffab0);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffab0);
    local_478 = operator____catch_sr
                          ((char *)in_stack_fffffffffffffab0,
                           CONCAT44(in_stack_fffffffffffffaac,uVar2));
    this_00 = &local_488;
    Catch::SourceLineInfo::SourceLineInfo
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/NumericTests.cpp"
               ,0x180);
    operator____catch_sr
              ((char *)in_stack_fffffffffffffab0,CONCAT44(in_stack_fffffffffffffaac,uVar2));
    uVar2 = 2;
    macroName_04.m_size = (size_type)puVar3;
    macroName_04.m_start = (char *)this_01;
    capturedExpression_04.m_size = (size_type)in_stack_fffffffffffffac0.m_lhs;
    capturedExpression_04.m_start = (char *)this_00;
    Catch::AssertionHandler::AssertionHandler
              (in_stack_fffffffffffffab0,macroName_04,
               (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffaac,2),capturedExpression_04,
               (Flags)rhs.m_lhs);
    this = Catch::operator<=<const_slang::SVInt_&,_0>
                     ((Decomposer *)CONCAT44(in_stack_fffffffffffffaac,uVar2),(SVInt *)0x84f1b5);
    Catch::operator==((ExprLhs<const_slang::SVInt_&> *)this_02,rhs.m_lhs);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)this.m_lhs,
               (ITransientExpression *)CONCAT44(in_stack_fffffffffffffaac,uVar2));
    Catch::AssertionHandler::complete((AssertionHandler *)this.m_lhs);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this.m_lhs);
  }
  slang::SVInt::~SVInt(in_stack_fffffffffffffac0.m_lhs);
  slang::SVInt::~SVInt(in_stack_fffffffffffffac0.m_lhs);
  slang::SVInt::~SVInt(in_stack_fffffffffffffac0.m_lhs);
  return;
}

Assistant:

void testDiv(const SVInt& a, const SVInt& b, const SVInt& c) {
    // Test division and remainder using: (a * b + c) / a
    REQUIRE(a >= b);
    REQUIRE(a > c);

    auto p = a * b + c;
    auto q = p / a;
    auto r = p % a;
    CHECK(b == q);
    CHECK(c == r);

    if (b > c) {
        q = p / b;
        r = p % b;
        CHECK(a == q);
        CHECK(c == r);
    }
}